

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::bufferSubData
          (ReferenceContext *this,deUint32 target,deIntptr offset,deIntptr size,void *data)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  DataBuffer *this_00;
  deUint8 *pdVar4;
  DataBuffer *buffer;
  void *data_local;
  deIntptr size_local;
  deIntptr offset_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  do {
    bVar1 = isValidBufferTarget(target);
    if (!bVar1) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  while ((-1 < offset && (-1 < size))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      this_00 = getBufferBinding(this,target);
      do {
        if (this_00 == (DataBuffer *)0x0) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      do {
        iVar3 = rc::DataBuffer::getSize(this_00);
        if (iVar3 < (int)offset + (int)size) {
          setError(this,0x501);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pdVar4 = rc::DataBuffer::getData(this_00);
      ::deMemcpy(pdVar4 + offset,data,(long)(int)size);
      return;
    }
  }
  setError(this,0x501);
  return;
}

Assistant:

void ReferenceContext::bufferSubData (deUint32 target, deIntptr offset, deIntptr size, const void* data)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(offset < 0 || size < 0, GL_INVALID_VALUE, RC_RET_VOID);

	DataBuffer* buffer = getBufferBinding(target);

	RC_IF_ERROR(!buffer, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR((int)(offset+size) > buffer->getSize(), GL_INVALID_VALUE, RC_RET_VOID);

	deMemcpy(buffer->getData()+offset, data, (int)size);
}